

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O0

int cueify_full_toc_serialize(cueify_full_toc *t,uint8_t *buffer,size_t *size)

{
  ushort uVar1;
  short sVar2;
  byte *pbVar3;
  uint local_48;
  byte local_41;
  int i;
  uint8_t cur_session;
  uint8_t *bp;
  uint16_t toc_length;
  cueify_full_toc_private *toc;
  size_t *size_local;
  uint8_t *buffer_local;
  cueify_full_toc *t_local;
  
  local_41 = 0;
  if ((t == (cueify_full_toc *)0x0) || (size == (size_t *)0x0)) {
    t_local._4_4_ = 3;
  }
  else {
    sVar2 = (((ushort)*(byte *)((long)t + 3) - (ushort)*(byte *)((long)t + 2)) + 1 +
            (((ushort)*(byte *)((long)t + 1) - (ushort)*(byte *)t) + 1) * 3) * 0xb;
    uVar1 = sVar2 + 4;
    *size = (ulong)uVar1;
    if (buffer == (uint8_t *)0x0) {
      t_local._4_4_ = 0;
    }
    else if (*size < (ulong)uVar1) {
      t_local._4_4_ = 8;
    }
    else {
      sVar2 = sVar2 + 2;
      *buffer = (uint8_t)((ushort)sVar2 >> 8);
      buffer[1] = (uint8_t)sVar2;
      buffer[2] = *(uint8_t *)t;
      buffer[3] = *(uint8_t *)((long)t + 1);
      _i = buffer + 4;
      for (local_48 = (uint)*(byte *)((long)t + 2);
          (int)local_48 <= (int)(uint)*(byte *)((long)t + 3); local_48 = local_48 + 1) {
        if (*(byte *)((long)t + (long)(int)local_48 * 9 + 4) != local_41) {
          local_41 = *(byte *)((long)t + (long)(int)local_48 * 9 + 4);
          pbVar3 = _i + 1;
          *_i = local_41;
          *pbVar3 = 0;
          *pbVar3 = *pbVar3 | *(char *)((long)t + (ulong)local_41 * 0x21 + 0x398) << 4;
          *pbVar3 = *pbVar3 | *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x399) & 0xf;
          _i[2] = 0;
          _i[3] = 0xa0;
          _i[4] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x39a);
          _i[5] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x39b);
          _i[6] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x39c);
          _i[7] = 0;
          _i[8] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x388);
          _i[9] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x38a);
          _i[10] = 0;
          pbVar3 = _i + 0xc;
          _i[0xb] = local_41;
          *pbVar3 = 0;
          *pbVar3 = *pbVar3 | *(char *)((long)t + (ulong)local_41 * 0x21 + 0x3a1) << 4;
          *pbVar3 = *pbVar3 | *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x3a2) & 0xf;
          _i[0xd] = 0;
          _i[0xe] = 0xa1;
          _i[0xf] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x3a3);
          _i[0x10] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x3a4);
          _i[0x11] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x3a5);
          _i[0x12] = 0;
          _i[0x13] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x389);
          _i[0x14] = 0;
          _i[0x15] = 0;
          pbVar3 = _i + 0x17;
          _i[0x16] = local_41;
          *pbVar3 = 0;
          *pbVar3 = *pbVar3 | *(char *)((long)t + (ulong)local_41 * 0x21 + 0x38f) << 4;
          *pbVar3 = *pbVar3 | *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x390) & 0xf;
          _i[0x18] = 0;
          _i[0x19] = 0xa2;
          _i[0x1a] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x391);
          _i[0x1b] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x392);
          _i[0x1c] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x393);
          _i[0x1d] = 0;
          _i[0x1e] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x38b);
          pbVar3 = _i + 0x20;
          _i[0x1f] = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x38c);
          _i = _i + 0x21;
          *pbVar3 = *(byte *)((long)t + (ulong)local_41 * 0x21 + 0x38d);
        }
        pbVar3 = _i + 1;
        *_i = *(byte *)((long)t + (long)(int)local_48 * 9 + 4);
        *pbVar3 = 0;
        *pbVar3 = *pbVar3 | *(char *)((long)t + (long)(int)local_48 * 9 + 5) << 4;
        *pbVar3 = *pbVar3 | *(byte *)((long)t + (long)(int)local_48 * 9 + 6) & 0xf;
        _i[2] = 0;
        _i[3] = (byte)local_48;
        _i[4] = *(byte *)((long)t + (long)(int)local_48 * 9 + 7);
        _i[5] = *(byte *)((long)t + (long)(int)local_48 * 9 + 8);
        _i[6] = *(byte *)((long)t + (long)(int)local_48 * 9 + 9);
        _i[7] = 0;
        _i[8] = *(byte *)((long)t + (long)(int)local_48 * 9 + 10);
        pbVar3 = _i + 10;
        _i[9] = *(byte *)((long)t + (long)(int)local_48 * 9 + 0xb);
        _i = _i + 0xb;
        *pbVar3 = *(byte *)((long)t + (long)(int)local_48 * 9 + 0xc);
      }
      t_local._4_4_ = 0;
    }
  }
  return t_local._4_4_;
}

Assistant:

int cueify_full_toc_serialize(cueify_full_toc *t, uint8_t *buffer,
			      size_t *size) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;
    uint16_t toc_length;
    uint8_t *bp;
    uint8_t cur_session = 0;
    int i;

    if (t == NULL || size == NULL) {
	return CUEIFY_ERR_BADARG;
    }

    toc_length =
	( (toc->last_track_number   - toc->first_track_number   + 1) +
	 ((toc->last_session_number - toc->first_session_number + 1) * 3)) * 11
	+ 4;
    *size = toc_length;
    if (buffer == NULL) {
	return CUEIFY_OK;
    } else if (*size < toc_length) {
	return CUEIFY_ERR_TOOSMALL;
    }

    /* TOC Data Length */
    toc_length -= 2;
    buffer[0] = toc_length >> 8;
    buffer[1] = toc_length & 0xFF;

    /* First Complete Session Number */
    buffer[2] = toc->first_session_number;
    /* Last Complete Session Number */
    buffer[3] = toc->last_session_number;

    /* TOC Track Descriptor(s) */
    bp = buffer + 4;
    for (i = toc->first_track_number; i <= toc->last_track_number; i++) {
	if (toc->tracks[i].session != cur_session) {
	    /* New session.  Add session-specific lines first. */
	    cur_session = toc->tracks[i].session;

	    /* POINT = 0xA0 */
	    /* Session Number */
	    *bp++ = cur_session;
	    /* ADR */
	    *bp = 0;
	    *bp |= toc->sessions[cur_session].pseudotracks[1].adr << 4;
	    /* CONTROL */
	    *bp++ |= toc->sessions[cur_session].pseudotracks[1].control & 0x0F;
	    /* TNO */
	    *bp++ = 0;
	    /* POINT */
	    *bp++ = 0xA0;
	    /* Min */
	    *bp++ = toc->sessions[cur_session].pseudotracks[1].atime.min;
	    /* Sec */
	    *bp++ = toc->sessions[cur_session].pseudotracks[1].atime.sec;
	    /* Frm */
	    *bp++ = toc->sessions[cur_session].pseudotracks[1].atime.frm;
	    /* Zero */
	    *bp++ = 0;
	    /* First Track Number */
	    *bp++ = toc->sessions[cur_session].first_track_number;
	    /* Disc Type */
	    *bp++ = toc->sessions[cur_session].session_type;
	    /* Reserved */
	    *bp++ = 0;

	    /* POINT = 0xA1 */
	    /* Session Number */
	    *bp++ = cur_session;
	    /* ADR */
	    *bp = 0;
	    *bp |= toc->sessions[cur_session].pseudotracks[2].adr << 4;
	    /* CONTROL */
	    *bp++ |= toc->sessions[cur_session].pseudotracks[2].control & 0x0F;
	    /* TNO */
	    *bp++ = 0;
	    /* POINT */
	    *bp++ = 0xA1;
	    /* Min */
	    *bp++ = toc->sessions[cur_session].pseudotracks[2].atime.min;
	    /* Sec */
	    *bp++ = toc->sessions[cur_session].pseudotracks[2].atime.sec;
	    /* Frm */
	    *bp++ = toc->sessions[cur_session].pseudotracks[2].atime.frm;
	    /* Zero */
	    *bp++ = 0;
	    /* First Track Number */
	    *bp++ = toc->sessions[cur_session].last_track_number;
	    /* Reserved */
	    *bp++ = 0;
	    *bp++ = 0;

	    /* POINT = 0xA2 */
	    /* Session Number */
	    *bp++ = cur_session;
	    /* ADR */
	    *bp = 0;
	    *bp |= toc->sessions[cur_session].pseudotracks[0].adr << 4;
	    /* CONTROL */
	    *bp++ |= toc->sessions[cur_session].pseudotracks[0].control & 0x0F;
	    /* TNO */
	    *bp++ = 0;
	    /* POINT */
	    *bp++ = 0xA2;
	    /* Min */
	    *bp++ = toc->sessions[cur_session].pseudotracks[0].atime.min;
	    /* Sec */
	    *bp++ = toc->sessions[cur_session].pseudotracks[0].atime.sec;
	    /* Frm */
	    *bp++ = toc->sessions[cur_session].pseudotracks[0].atime.frm;
	    /* Zero */
	    *bp++ = 0;
	    /* PMIN */
	    *bp++ = toc->sessions[cur_session].leadout.min;
	    /* PSEC */
	    *bp++ = toc->sessions[cur_session].leadout.sec;
	    /* PFRAME */
	    *bp++ = toc->sessions[cur_session].leadout.frm;
	}

	/* Session Number */
	*bp++ = toc->tracks[i].session;
	/* ADR */
	*bp = 0;
	*bp |= toc->tracks[i].adr << 4;
	/* CONTROL */
	*bp++ |= toc->tracks[i].control & 0x0F;
	/* TNO */
	*bp++ = 0;
	/* POINT */
	*bp++ = i;
	/* Min */
	*bp++ = toc->tracks[i].atime.min;
	/* Sec */
	*bp++ = toc->tracks[i].atime.sec;
	/* Frame */
	*bp++ = toc->tracks[i].atime.frm;
	/* Zero */
	*bp++ = 0;
	/* PMIN */
	*bp++ = toc->tracks[i].offset.min;
	/* PSEC */
	*bp++ = toc->tracks[i].offset.sec;
	/* PFRAME */
	*bp++ = toc->tracks[i].offset.frm;
    }

    return CUEIFY_OK;
}